

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,OpaqueType *type)

{
  OpaqueType *type_;
  bool bVar1;
  UnsupportedType *this_00;
  allocator local_39;
  string local_38;
  OpaqueType *local_18;
  OpaqueType *type_local;
  IDLTypeIdentifierVisitor *this_local;
  
  local_18 = type;
  type_local = (OpaqueType *)this;
  bVar1 = IDLExport::marshalOpaquesAsAny(this->m_exporter);
  if (!bVar1) {
    this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
    type_ = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"opaque types are not allowed in IDL",&local_39);
    Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type_,&local_38);
    __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,
                Typelib::UnsupportedType::~UnsupportedType);
  }
  std::__cxx11::string::operator=((string *)&this->m_namespace,"");
  std::__cxx11::string::operator=((string *)&this->m_front,"any");
  return true;
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(OpaqueType const& type)
    {
        if (m_exporter.marshalOpaquesAsAny())
        {
            m_namespace = "";
            m_front = "any";
        }
        else
            throw UnsupportedType(type, "opaque types are not allowed in IDL");

        return true;
    }